

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.h
# Opt level: O0

bool __thiscall luna::StackAPI::CheckArgs<luna::ValueT>(StackAPI *this,int minCount,ValueT types)

{
  int index;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  int params;
  ValueT type;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined1 local_1;
  
  index = GetStackSize((StackAPI *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  type = (ValueT)((ulong)in_RDI >> 0x20);
  if (index < in_ESI) {
    ArgCountError((StackAPI *)CONCAT44(index,in_stack_ffffffffffffffe0),type);
    local_1 = false;
  }
  else {
    local_1 = CheckArgs<>((StackAPI *)CONCAT44(in_ESI,in_EDX),index,in_stack_ffffffffffffffe0,type);
  }
  return local_1;
}

Assistant:

bool CheckArgs(int minCount, ValueTypes... types)
        {
            // Check count of arguments
            auto params = GetStackSize();
            if (params < minCount)
            {
                ArgCountError(minCount);
                return false;
            }

            return CheckArgs(0, params, types...);
        }